

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::java::NestedInFileClass(EnumDescriptor *descriptor,bool immutable)

{
  byte bVar1;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
  *in_RCX;
  char *failure_msg;
  int line;
  JavaFeatures local_48;
  
  ValidateNestInFileClassFeature((java *)&local_48,descriptor);
  if (local_48.super_Message.super_MessageLite._vptr_MessageLite == (_func_int **)0x1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_48,
                             "ValidateNestInFileClassFeature(descriptor) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)&local_48);
  if (local_48.super_Message.super_MessageLite._vptr_MessageLite == (_func_int **)0x1) {
    protobuf::internal::InternalFeatureHelper::
    GetResolvedFeatureExtension<google::protobuf::EnumDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
              (&local_48,(InternalFeatureHelper *)descriptor,(EnumDescriptor *)pb::java,in_RCX);
    pb::JavaFeatures::~JavaFeatures(&local_48);
    if (local_48.field_0._impl_.nest_in_file_class_ == 3) {
      bVar1 = (descriptor->file_->options_->field_0)._impl_.java_multiple_files_ ^ 1;
    }
    else {
      bVar1 = 1;
      if (local_48.field_0._impl_.nest_in_file_class_ != 2) {
        if (local_48.field_0._impl_.nest_in_file_class_ == 0) {
          failure_msg = 
          "nest_in_file_class != pb::JavaFeatures::NestInFileClassFeature::NEST_IN_FILE_CLASS_UNKNOWN"
          ;
          line = 0x3a9;
          goto LAB_00173d48;
        }
        bVar1 = 0;
      }
    }
    return (bool)bVar1;
  }
  line = 0x3da;
LAB_00173d48:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

bool NestedInFileClass(const EnumDescriptor& descriptor, bool immutable) {
  ABSL_CHECK_OK(ValidateNestInFileClassFeature(descriptor));
  return NestInFileClass(descriptor, immutable);
}